

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Option *pOVar1;
  initializer_list<Level> __l;
  allocator local_2ad;
  allocator local_2ac;
  allocator_type local_2ab;
  less<Level> local_2aa;
  allocator local_2a9;
  Level level;
  undefined8 local_2a4;
  undefined4 local_29c;
  string local_298 [32];
  string local_278;
  string local_258;
  string local_238;
  _Rb_tree<Level,_Level,_std::_Identity<Level>,_std::less<Level>,_std::allocator<Level>_> local_218;
  App app;
  
  std::__cxx11::string::string((string *)&local_238,"",(allocator *)&local_2a4);
  CLI::App::App(&app,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::string((string *)&local_258,"-l,--level",&local_2a9);
  local_2a4 = 0x100000000;
  local_29c = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_2a4;
  CLI::std::set<Level,_std::less<Level>,_std::allocator<Level>_>::set
            ((set<Level,_std::less<Level>,_std::allocator<Level>_> *)&local_218,__l,&local_2aa,
             &local_2ab);
  std::__cxx11::string::string((string *)&local_278,"Level settings",&local_2ac);
  pOVar1 = CLI::App::add_set<Level>
                     (&app,&local_258,&level,
                      (set<Level,_std::less<Level>,_std::allocator<Level>_> *)&local_218,&local_278)
  ;
  std::__cxx11::string::string(local_298,"enum/Level in {High=0, Medium=1, Low=2}",&local_2ad);
  std::__cxx11::string::_M_assign((string *)&pOVar1->typeval_);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string((string *)&local_278);
  CLI::std::_Rb_tree<Level,_Level,_std::_Identity<Level>,_std::less<Level>,_std::allocator<Level>_>
  ::~_Rb_tree(&local_218);
  std::__cxx11::string::~string((string *)&local_258);
  CLI::App::parse(&app,argc,argv);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app;

    Level level;
    app.add_set("-l,--level", level, {High, Medium, Low}, "Level settings")
        ->set_type_name("enum/Level in {High=0, Medium=1, Low=2}");

    CLI11_PARSE(app, argc, argv);

    return 0;
}